

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O2

int test_hduname(int hdunum1,int hdunum2)

{
  HduName *pHVar1;
  HduName *pHVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  pHVar1 = hduname[(long)hdunum1 + -1];
  iVar4 = 0;
  iVar5 = 0;
  if ((pHVar1->extname[0] != '\0') &&
     (pHVar2 = hduname[(long)hdunum2 + -1], pHVar2->extname[0] != '\0')) {
    iVar3 = strcmp(pHVar1->extname,pHVar2->extname);
    iVar5 = iVar4;
    if ((iVar3 == 0) &&
       (((pHVar1->hdutype == pHVar2->hdutype && (hdunum1 != hdunum2)) &&
        (pHVar2->extver == pHVar1->extver)))) {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int test_hduname (int hdunum1,		/* index of first hdu */
		  int hdunum2		/* index of second hdu */
                  )
{ 
    HduName *p1;
    HduName *p2; 

    p1 = hduname[hdunum1-1];
    p2 = hduname[hdunum2-1];
    if(!strlen(p1->extname) || !strlen(p2->extname)) return 0;
    if(!strcmp(p1->extname,p2->extname) && p1->hdutype == p2->hdutype
       && p2->extver == p1->extver && hdunum1 != hdunum2){ 
	   return 1;
    } 
    return 0;
}